

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

const_iterator * __thiscall
ft::mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::find
          (const_iterator *__return_storage_ptr__,
          mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          key_type *k)

{
  int iVar1;
  int iVar2;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  treeNode<ft::pair<const_int,_int>_> *ptVar4;
  treeNode<ft::pair<const_int,_int>_> *ptVar5;
  treeNode<ft::pair<const_int,_int>_> *ptVar6;
  treeNode<ft::pair<const_int,_int>_> *ptVar7;
  long lVar8;
  
  ptVar3 = (this->
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           ).m_tree.NIL;
  ptVar7 = (this->
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           ).m_tree.m_root;
  ptVar4 = (this->
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           ).m_tree.m_first;
  ptVar5 = (this->
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           ).m_tree.m_last;
  ptVar6 = ptVar5;
  if ((ptVar5 != ptVar7 && ptVar4 != ptVar7) &&
      (ptVar3 != ptVar7 && ptVar7 != (treeNode<ft::pair<const_int,_int>_> *)0x0)) {
    iVar1 = *k;
    while( true ) {
      iVar2 = (ptVar7->value).first;
      ptVar6 = ptVar7;
      if (iVar1 == iVar2) break;
      lVar8 = 0x18;
      if ((iVar1 != iVar2 && iVar2 <= iVar1) || (lVar8 = 0x10, iVar1 < iVar2)) {
        ptVar7 = *(treeNode<ft::pair<const_int,_int>_> **)((long)&(ptVar7->value).first + lVar8);
      }
      ptVar6 = ptVar5;
      if ((((ptVar7 == (treeNode<ft::pair<const_int,_int>_> *)0x0) || (ptVar3 == ptVar7)) ||
          (ptVar4 == ptVar7)) || (ptVar5 == ptVar7)) break;
    }
  }
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  ).m_tree = &(this->
              super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
              ).m_tree;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  ).m_node = ptVar6;
  (__return_storage_ptr__->
  super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
  )._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113d00;
  return __return_storage_ptr__;
}

Assistant:

const_iterator	find(key_type const & k) const
	{
		node*	node = this->root();
		while (this->validNode(node))
		{
			if (this->equal(node->value.first, k)) return const_iterator(this->m_tree, node);
			else if (this->key_comp()(node->value.first, k)) node = node->right;
			else if (this->key_comp()(k, node->value.first)) node = node->left;
		}
		return this->end();
	}